

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatActivity.c
# Opt level: O0

void Msat_SolverVarBumpActivity(Msat_Solver_t *p,Msat_Lit_t Lit)

{
  int Var_00;
  Msat_Var_t Var;
  Msat_Lit_t Lit_local;
  Msat_Solver_t *p_local;
  
  if (0.0 < p->dVarDecay || p->dVarDecay == 0.0) {
    Var_00 = Lit >> 1;
    p->pdActivity[Var_00] = p->dVarInc + p->pdActivity[Var_00];
    if (1e+100 < p->pdActivity[Var_00]) {
      Msat_SolverVarRescaleActivity(p);
    }
    Msat_OrderUpdate(p->pOrder,Var_00);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Msat_SolverVarBumpActivity( Msat_Solver_t * p, Msat_Lit_t Lit )
{
    Msat_Var_t Var;
    if ( p->dVarDecay < 0 ) // (negative decay means static variable order -- don't bump)
        return;
    Var = MSAT_LIT2VAR(Lit);
    p->pdActivity[Var] += p->dVarInc;
//    p->pdActivity[Var] += p->dVarInc * p->pFactors[Var];
    if ( p->pdActivity[Var] > 1e100 )
        Msat_SolverVarRescaleActivity( p );
    Msat_OrderUpdate( p->pOrder, Var );
}